

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::CallForHelp::CallForHelp(CallForHelp *this)

{
  allocator<char> local_31;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"This should be caught in your main function, see examples",
             &local_31);
  CallForHelp(this,&local_30,Success);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}